

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::analysis::DebugInfoManager::DerefDebugExpression
          (DebugInfoManager *this,Instruction *dbg_expr)

{
  CommonDebugInfoInstructions CVar1;
  uint32_t res_id;
  Instruction *pIVar2;
  Instruction *this_00;
  DefUseManager *this_01;
  initializer_list<unsigned_int> init_list;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_90;
  uint32_t local_84;
  Operand local_80;
  SmallVector<unsigned_int,_2UL> local_50;
  
  CVar1 = Instruction::GetCommonDebugOpcode(dbg_expr);
  if (CVar1 == CommonDebugInfoDebugExpression) {
    pIVar2 = Instruction::Clone(dbg_expr,this->context_);
    local_90._M_head_impl = pIVar2;
    res_id = IRContext::TakeNextId(this->context_);
    Instruction::SetResultId(pIVar2,res_id);
    this_00 = GetDebugOperationWithDeref(this);
    local_84 = Instruction::result_id(this_00);
    init_list._M_len = 1;
    init_list._M_array = &local_84;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_50,init_list);
    local_80.type = SPV_OPERAND_TYPE_ID;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_80.words,&local_50);
    Instruction::InsertOperand(pIVar2,4,&local_80);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_80.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_50);
    pIVar2 = Instruction::InsertBefore
                       (&(((this->context_->module_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                         ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.
                         sentinel_,
                        (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         *)&local_90);
    AnalyzeDebugInst(this,pIVar2);
    if ((this->context_->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      this_01 = IRContext::get_def_use_mgr(this->context_);
      DefUseManager::AnalyzeInstDefUse(this_01,pIVar2);
    }
    if (local_90._M_head_impl != (Instruction *)0x0) {
      (*((local_90._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
    return pIVar2;
  }
  __assert_fail("dbg_expr->GetCommonDebugOpcode() == CommonDebugInfoDebugExpression",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                ,0x177,
                "Instruction *spvtools::opt::analysis::DebugInfoManager::DerefDebugExpression(Instruction *)"
               );
}

Assistant:

Instruction* DebugInfoManager::DerefDebugExpression(Instruction* dbg_expr) {
  assert(dbg_expr->GetCommonDebugOpcode() == CommonDebugInfoDebugExpression);
  std::unique_ptr<Instruction> deref_expr(dbg_expr->Clone(context()));
  deref_expr->SetResultId(context()->TakeNextId());
  deref_expr->InsertOperand(
      kDebugExpressOperandOperationIndex,
      {SPV_OPERAND_TYPE_ID, {GetDebugOperationWithDeref()->result_id()}});
  auto* deref_expr_instr =
      context()->ext_inst_debuginfo_end()->InsertBefore(std::move(deref_expr));
  AnalyzeDebugInst(deref_expr_instr);
  if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(deref_expr_instr);
  return deref_expr_instr;
}